

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

bool __thiscall
libcellml::Validator::ValidatorImpl::hasTwoMathmlSiblings
          (ValidatorImpl *this,XmlNodePtr *parentNode,XmlNodePtr *node,ComponentPtr *component)

{
  size_t sVar1;
  element_type *this_00;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ComponentPtr *local_30;
  ComponentPtr *component_local;
  XmlNodePtr *node_local;
  XmlNodePtr *parentNode_local;
  ValidatorImpl *this_local;
  
  local_30 = component;
  component_local = (ComponentPtr *)node;
  node_local = parentNode;
  parentNode_local = (XmlNodePtr *)this;
  sVar1 = mathmlChildCount(parentNode);
  if (sVar1 != 3) {
    this_00 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)component_local);
    XmlNode::name_abi_cxx11_(&local_90,this_00);
    std::operator+(&local_70,"Math has a \'",&local_90);
    std::operator+(&local_50,&local_70,"\' element without exactly two MathML siblings.");
    addMathmlIssue(this,&local_50,MATH_MATHML,local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return sVar1 == 3;
}

Assistant:

bool Validator::ValidatorImpl::hasTwoMathmlSiblings(const XmlNodePtr &parentNode,
                                                    const XmlNodePtr &node,
                                                    const ComponentPtr &component)
{
    if (mathmlChildCount(parentNode) != 3) {
        addMathmlIssue("Math has a '" + node->name() + "' element without exactly two MathML siblings.",
                       Issue::ReferenceRule::MATH_MATHML,
                       component);

        return false;
    }

    return true;
}